

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  FieldDescriptor *field;
  FieldGenerator *pFVar2;
  int local_1c;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  io::Printer::Print(printer,"void $classname$::SharedCtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"_cached_size_ = 0;\n");
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(this->descriptor_);
    if (iVar1 <= local_1c) break;
    field = Descriptor::field(this->descriptor_,local_1c);
    pFVar2 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar2->_vptr_FieldGenerator[9])(pFVar2,printer);
    local_1c = local_1c + 1;
  }
  io::Printer::Print(printer,"::memset(_has_bits_, 0, sizeof(_has_bits_));\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedConstructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedCtor() {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "_cached_size_ = 0;\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateConstructorCode(printer);
  }

  printer->Print(
    "::memset(_has_bits_, 0, sizeof(_has_bits_));\n");

  printer->Outdent();
  printer->Print("}\n\n");
}